

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_custom.c
# Opt level: O0

size_t log_policy_format_custom_serialize
                 (log_policy policy,log_record record,void *buffer,size_t size)

{
  code *pcVar1;
  undefined8 uVar2;
  log_level_id level;
  undefined8 *puVar3;
  time_t *__timer;
  char *pcVar4;
  uint64_t uVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  log_record_va_list_type *plVar11;
  undefined8 in_RCX;
  undefined8 in_RDX;
  log_record in_RSI;
  log_policy in_RDI;
  log_policy_format_custom_data custom_data;
  
  puVar3 = (undefined8 *)log_policy_instance(in_RDI);
  pcVar1 = (code *)puVar3[2];
  uVar2 = *puVar3;
  __timer = log_record_time(in_RSI);
  pcVar4 = ctime(__timer);
  uVar5 = log_record_thread_id(in_RSI);
  sVar6 = log_record_line(in_RSI);
  pcVar7 = log_record_func(in_RSI);
  pcVar8 = log_record_file(in_RSI);
  level = log_record_level(in_RSI);
  pcVar9 = log_level_to_string(level);
  pcVar10 = log_record_message(in_RSI);
  plVar11 = log_record_variable_args(in_RSI);
  sVar6 = (*pcVar1)(uVar2,in_RDX,in_RCX,pcVar4,uVar5,sVar6,pcVar7,pcVar8,pcVar9,pcVar10,plVar11);
  return sVar6;
}

Assistant:

static size_t log_policy_format_custom_serialize(log_policy policy, const log_record record, void *buffer, const size_t size)
{
	log_policy_format_custom_data custom_data = log_policy_instance(policy);

	return custom_data->format_serialize(custom_data->context, buffer, size,
		ctime(log_record_time(record)),
		log_record_thread_id(record),
		log_record_line(record),
		log_record_func(record),
		log_record_file(record),
		log_level_to_string(log_record_level(record)),
		log_record_message(record),
		(log_policy_format_custom_va_list)log_record_variable_args(record));
}